

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O1

Opnd * __thiscall LowererMD::Simd128CanonicalizeToBoolsBeforeReduction(LowererMD *this,Instr *instr)

{
  Opnd *src;
  code *pcVar1;
  bool bVar2;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar3;
  RegOpnd *dst;
  uint uVar4;
  OpCode local_2a [4];
  OpCode cmpOpcode;
  
  src = instr->m_src1;
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar2 = JITTimeFunctionBody::IsWasmFunction(this_00);
  if (!bVar2) {
    return src;
  }
  local_2a[0] = InvalidOpCode;
  uVar4 = instr->m_opcode - 0x3c1;
  if (uVar4 < 0x12) {
    if ((3U >> (uVar4 & 0x1f) & 1) == 0) {
      if ((0xc00U >> (uVar4 & 0x1f) & 1) != 0) {
        local_2a[0] = PCMPEQW;
        goto LAB_0067e449;
      }
      if ((0x30000U >> (uVar4 & 0x1f) & 1) != 0) {
        local_2a[0] = PCMPEQB;
        goto LAB_0067e449;
      }
      goto LAB_0067e3dd;
    }
  }
  else {
LAB_0067e3dd:
    if (1 < instr->m_opcode - 0x2d3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x874,"((0))","UNREACHED");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      goto LAB_0067e449;
    }
  }
  local_2a[0] = PCMPEQD;
LAB_0067e449:
  dst = IR::RegOpnd::New(src->m_type,this->m_func);
  Lowerer::InsertMove(&dst->super_Opnd,src,instr,true);
  Simd128CanonicalizeToBools(this,instr,local_2a,&dst->super_Opnd);
  return &dst->super_Opnd;
}

Assistant:

IR::Opnd* LowererMD::Simd128CanonicalizeToBoolsBeforeReduction(IR::Instr* instr)
{
    IR::Opnd* src1 = instr->GetSrc1();
    if (m_func->GetJITFunctionBody()->IsWasmFunction())
    {
        Js::OpCode cmpOpcode = Js::OpCode::InvalidOpCode;
        switch (instr->m_opcode)
        {
        case Js::OpCode::Simd128_AnyTrue_B4:
        case Js::OpCode::Simd128_AnyTrue_B2:
        case Js::OpCode::Simd128_AllTrue_B4:
        case Js::OpCode::Simd128_AllTrue_B2:
            cmpOpcode = Js::OpCode::PCMPEQD;
            break;
        case Js::OpCode::Simd128_AnyTrue_B8:
        case Js::OpCode::Simd128_AllTrue_B8:
            cmpOpcode = Js::OpCode::PCMPEQW;
            break;
        case Js::OpCode::Simd128_AnyTrue_B16:
        case Js::OpCode::Simd128_AllTrue_B16:
            cmpOpcode = Js::OpCode::PCMPEQB;
            break;
        default:
            Assert(UNREACHED);
        }

        IR::RegOpnd * newSrc = IR::RegOpnd::New(src1->GetType(), m_func);
        m_lowerer->InsertMove(newSrc, src1, instr);
        Simd128CanonicalizeToBools(instr, cmpOpcode, *newSrc);
        return newSrc;
    }
    return src1;
}